

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::CBString(CBString *this,char c,int len)

{
  uchar *__s;
  CBStringException *this_00;
  CBStringException bstr__cppwrapper_exception;
  string local_68;
  CBStringException local_48;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a9850;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (-1 < len) {
    (this->super_tagbstring).mlen = len + 1U;
    (this->super_tagbstring).slen = len;
    __s = (uchar *)malloc((ulong)(len + 1U));
    (this->super_tagbstring).data = __s;
    if (__s != (uchar *)0x0) {
      if (len != 0) {
        memset(__s,(uint)(byte)c,(ulong)(uint)len);
      }
      __s[(uint)len] = '\0';
      return;
    }
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"CBString::Failure in repeat(char) constructor","");
  CBStringException::CBStringException(&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_48);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (char c, int len) {
	data = NULL;
	if (len >= 0) {
		mlen = len + 1;
		slen = len;
		data = (unsigned char *) bstr__alloc (mlen);
	}
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in repeat(char) constructor");
	} else {
		if (slen > 0) bstr__memset (data, c, slen);
		data[slen] = '\0';
	}
}